

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

NodeText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeNodeTextWithoutNested
          (NodeText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr namespace_,StringPtr scope
          ,StringPtr name,Schema schema,Array<kj::StringTree> *nestedTypeDecls,
          TemplateContext *templateContext)

{
  Reader proto_00;
  Reader proto_01;
  Reader value;
  Reader value_00;
  Array<kj::StringTree> nestedTypeDecls_00;
  Array<kj::StringTree> nestedTypeDecls_01;
  EnumSchema EVar1;
  SegmentReader *pSVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  size_t sVar7;
  size_t sVar8;
  undefined2 uVar9;
  Which WVar10;
  uint32_t uVar11;
  Maybe<capnp::schema::Value::Reader> *pMVar12;
  StructSchema schema_00;
  InterfaceSchema schema_01;
  Branch *pBVar13;
  Branch *pBVar14;
  uint *params_1;
  StringTree *pSVar15;
  RemoveConst<kj::StringTree> *pRVar16;
  StringTree *pSVar17;
  undefined4 extraout_EDX;
  undefined4 uVar18;
  uint64_t annotationId;
  anon_union_8_2_eba6ea51_for_Type_5 aVar19;
  CppTypeName *value_01;
  CppTypeName *value_02;
  CppTypeName *extraout_RDX;
  CppTypeName *extraout_RDX_00;
  CppTypeName *extraout_RDX_01;
  CppTypeName *extraout_RDX_02;
  CppTypeName *extraout_RDX_03;
  CppTypeName *extraout_RDX_04;
  CppTypeName *extraout_RDX_05;
  CppTypeName *pCVar20;
  ulong capacity;
  char *pcVar21;
  unsigned_long uVar22;
  CapnpcCppMain *this_00;
  RawBrandedSchema *pRVar23;
  char (*pacVar24) [3];
  long *plVar25;
  ElementCount index;
  StringPtr name_00;
  Type TVar26;
  StringPtr SVar27;
  ReaderFor<capnp::Text> RVar28;
  ReaderFor<capnp::Data> RVar29;
  ArrayDisposer *pAVar30;
  ArrayPtr<const_char> *pAVar31;
  char (*pacVar32) [3];
  char (*pacVar33) [4];
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  Schema local_470;
  String constType;
  String constType_3;
  ArrayDisposer *local_430;
  Branch *pBStack_428;
  size_t sStack_420;
  ArrayDisposer *pAStack_418;
  String upperCase;
  ArrayBuilder<kj::StringTree> builder;
  Branch *pBStack_3c8;
  size_t sStack_3c0;
  ArrayDisposer *local_3b8;
  bool local_3af;
  StringTree local_3a8;
  char *local_358;
  Branch *local_350;
  undefined1 local_348 [16];
  Array<kj::StringTree> result;
  ArrayDisposer *local_320;
  Branch *local_318;
  size_t sStack_310;
  ArrayDisposer *local_308;
  Schema schema_local;
  char *linkage;
  undefined1 local_2d8 [16];
  StructText structText;
  undefined1 local_1b0 [24];
  Type type;
  EnumerantList enumerants;
  long local_148;
  long lStack_140;
  undefined8 *local_138;
  long local_128;
  long lStack_120;
  undefined8 *local_118;
  undefined1 local_108 [16];
  Reader proto_1;
  undefined1 local_c8 [24];
  ArrayDisposer *pAStack_b0;
  Branch *local_a8;
  size_t sStack_a0;
  ArrayDisposer *local_98;
  size_t sStack_90;
  CappedArray<char,_17UL> hexId;
  Reader proto;
  
  plVar25 = (long *)scope.content.size_;
  pRVar23 = (RawBrandedSchema *)scope.content.ptr;
  pBVar13 = (Branch *)namespace_.content.size_;
  pBVar14 = pBVar13;
  schema_local.raw = pRVar23;
  Schema::getProto(&proto,&schema_local);
  proto_00._reader.pointerCount = proto._reader.pointerCount;
  proto_00._reader._38_2_ = proto._reader._38_2_;
  proto_00._reader.dataSize = proto._reader.dataSize;
  pcVar21 = (char *)0xf264a779fef191ce;
  proto_00._reader.capTable = proto._reader.capTable;
  proto_00._reader.segment = proto._reader.segment;
  proto_00._reader.data = proto._reader.data;
  proto_00._reader.pointers = proto._reader.pointers;
  proto_00._reader.nestingLimit = proto._reader.nestingLimit;
  proto_00._reader._44_4_ = proto._reader._44_4_;
  pMVar12 = annotationValue<capnp::schema::Node::Reader>
                      ((Maybe<capnp::schema::Value::Reader> *)&structText,
                       (CapnpcCppMain *)0xf264a779fef191ce,proto_00,annotationId);
  uVar18 = extraout_EDX;
  if ((char)structText.outerTypeDecl.size_ == '\x01') {
    pRVar23 = (RawBrandedSchema *)(ulong)(structText.outerTypeDecl.branches.size_._4_2_ == 0);
    pMVar12 = (Maybe<capnp::schema::Value::Reader> *)structText.outerTypeDecl.text.content.size_;
    pBVar14 = structText.outerTypeDecl.branches.ptr;
    pcVar21 = structText.outerTypeDecl.text.content.ptr;
    uVar18 = structText.outerTypeDecl.branches.disposer._0_4_;
  }
  if ((char)structText.outerTypeDecl.size_ != '\0') {
    if (((ulong)pRVar23 & 1) != 0) {
      uVar18 = 0x7fffffff;
      pMVar12 = (Maybe<capnp::schema::Value::Reader> *)0x0;
      pBVar14 = (Branch *)0x0;
      pcVar21 = (char *)0x0;
    }
    structText.outerTypeDecl.text.content.disposer =
         (ArrayDisposer *)CONCAT44(structText.outerTypeDecl.text.content.disposer._4_4_,uVar18);
    structText.outerTypeDecl.size_ = (size_t)pcVar21;
    structText.outerTypeDecl.text.content.ptr = (char *)pMVar12;
    structText.outerTypeDecl.text.content.size_ = (size_t)pBVar14;
    name.content = (ArrayPtr<const_char>)
                   _::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&structText,(void *)0x0,0);
  }
  if (proto._reader.dataSize < 0x40) {
    uVar22 = 0;
  }
  else {
    uVar22 = *proto._reader.data;
  }
  kj::hex(&hexId,uVar22);
  SVar27 = name;
  if (proto._reader.dataSize < 0x70) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(undefined2 *)((long)proto._reader.data + 0xc);
  }
  switch(uVar9) {
  case 0:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47]>
              ((Fault *)&structText,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
               ,0xafd,FAILED,(char *)0x0,"\"This method shouldn\'t be called on file nodes.\"",
               (char (*) [47])"This method shouldn\'t be called on file nodes.");
    kj::_::Debug::Fault::fatal((Fault *)&structText);
  case 1:
    pAVar30 = (ArrayDisposer *)0x15f88c;
    schema_00 = Schema::asStruct(&schema_local);
    local_128 = *plVar25;
    lStack_120 = plVar25[1];
    local_118 = (undefined8 *)plVar25[2];
    *plVar25 = 0;
    plVar25[1] = 0;
    nestedTypeDecls_00.size_ = (size_t)schema.raw;
    nestedTypeDecls_00.ptr = (StringTree *)&local_128;
    nestedTypeDecls_00.disposer = pAVar30;
    makeStructText(&structText,this,namespace_,SVar27,schema_00,nestedTypeDecls_00,
                   (TemplateContext *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78))
    ;
    lVar5 = lStack_120;
    lVar4 = local_128;
    if (local_128 != 0) {
      local_128 = 0;
      lStack_120 = 0;
      (**(code **)*local_118)
                (local_118,lVar4,0x38,lVar5,lVar5,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    (__return_storage_ptr__->outerTypeDecl).size_ = structText.outerTypeDecl.size_;
    (__return_storage_ptr__->outerTypeDecl).text.content.ptr =
         structText.outerTypeDecl.text.content.ptr;
    (__return_storage_ptr__->outerTypeDecl).text.content.size_ =
         structText.outerTypeDecl.text.content.size_;
    (__return_storage_ptr__->outerTypeDecl).text.content.disposer =
         structText.outerTypeDecl.text.content.disposer;
    structText.outerTypeDecl.text.content.ptr = (char *)0x0;
    structText.outerTypeDecl.text.content.size_ = 0;
    (__return_storage_ptr__->outerTypeDecl).branches.ptr = structText.outerTypeDecl.branches.ptr;
    (__return_storage_ptr__->outerTypeDecl).branches.size_ = structText.outerTypeDecl.branches.size_
    ;
    (__return_storage_ptr__->outerTypeDecl).branches.disposer =
         structText.outerTypeDecl.branches.disposer;
    structText.outerTypeDecl.branches.ptr = (Branch *)0x0;
    structText.outerTypeDecl.branches.size_ = 0;
    (__return_storage_ptr__->outerTypeDef).size_ = structText.outerTypeDef.size_;
    (__return_storage_ptr__->outerTypeDef).text.content.ptr =
         structText.outerTypeDef.text.content.ptr;
    (__return_storage_ptr__->outerTypeDef).text.content.size_ =
         structText.outerTypeDef.text.content.size_;
    (__return_storage_ptr__->outerTypeDef).text.content.disposer =
         structText.outerTypeDef.text.content.disposer;
    structText.outerTypeDef.text.content.ptr = (char *)0x0;
    structText.outerTypeDef.text.content.size_ = 0;
    (__return_storage_ptr__->outerTypeDef).branches.ptr = structText.outerTypeDef.branches.ptr;
    (__return_storage_ptr__->outerTypeDef).branches.size_ = structText.outerTypeDef.branches.size_;
    (__return_storage_ptr__->outerTypeDef).branches.disposer =
         structText.outerTypeDef.branches.disposer;
    structText.outerTypeDef.branches.ptr = (Branch *)0x0;
    structText.outerTypeDef.branches.size_ = 0;
    (__return_storage_ptr__->readerBuilderDefs).size_ = structText.readerBuilderDefs.size_;
    (__return_storage_ptr__->readerBuilderDefs).text.content.ptr =
         structText.readerBuilderDefs.text.content.ptr;
    (__return_storage_ptr__->readerBuilderDefs).text.content.size_ =
         structText.readerBuilderDefs.text.content.size_;
    (__return_storage_ptr__->readerBuilderDefs).text.content.disposer =
         structText.readerBuilderDefs.text.content.disposer;
    structText.readerBuilderDefs.text.content.ptr = (char *)0x0;
    structText.readerBuilderDefs.text.content.size_ = 0;
    (__return_storage_ptr__->readerBuilderDefs).branches.ptr =
         structText.readerBuilderDefs.branches.ptr;
    (__return_storage_ptr__->readerBuilderDefs).branches.size_ =
         structText.readerBuilderDefs.branches.size_;
    (__return_storage_ptr__->readerBuilderDefs).branches.disposer =
         structText.readerBuilderDefs.branches.disposer;
    structText.readerBuilderDefs.branches.ptr = (Branch *)0x0;
    structText.readerBuilderDefs.branches.size_ = 0;
    (__return_storage_ptr__->inlineMethodDefs).size_ = structText.inlineMethodDefs.size_;
    (__return_storage_ptr__->inlineMethodDefs).text.content.ptr =
         structText.inlineMethodDefs.text.content.ptr;
    (__return_storage_ptr__->inlineMethodDefs).text.content.size_ =
         structText.inlineMethodDefs.text.content.size_;
    (__return_storage_ptr__->inlineMethodDefs).text.content.disposer =
         structText.inlineMethodDefs.text.content.disposer;
    structText.inlineMethodDefs.text.content.ptr = (char *)0x0;
    structText.inlineMethodDefs.text.content.size_ = 0;
    (__return_storage_ptr__->inlineMethodDefs).branches.ptr =
         structText.inlineMethodDefs.branches.ptr;
    (__return_storage_ptr__->inlineMethodDefs).branches.size_ =
         structText.inlineMethodDefs.branches.size_;
    (__return_storage_ptr__->inlineMethodDefs).branches.disposer =
         structText.inlineMethodDefs.branches.disposer;
    structText.inlineMethodDefs.branches.ptr = (Branch *)0x0;
    structText.inlineMethodDefs.branches.size_ = 0;
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    (__return_storage_ptr__->sourceFileDefs).size_ = structText.sourceDefs.size_;
    (__return_storage_ptr__->sourceFileDefs).text.content.ptr =
         structText.sourceDefs.text.content.ptr;
    (__return_storage_ptr__->sourceFileDefs).text.content.size_ =
         structText.sourceDefs.text.content.size_;
    (__return_storage_ptr__->sourceFileDefs).text.content.disposer =
         structText.sourceDefs.text.content.disposer;
    structText.sourceDefs.text.content.ptr = (char *)0x0;
    structText.sourceDefs.text.content.size_ = 0;
    (__return_storage_ptr__->sourceFileDefs).branches.ptr = structText.sourceDefs.branches.ptr;
    (__return_storage_ptr__->sourceFileDefs).branches.size_ = structText.sourceDefs.branches.size_;
    (__return_storage_ptr__->sourceFileDefs).branches.disposer =
         structText.sourceDefs.branches.disposer;
    structText.sourceDefs.branches.ptr = (Branch *)0x0;
    structText.sourceDefs.branches.size_ = 0;
    StructText::~StructText(&structText);
    break;
  case 2:
    structText.outerTypeDecl.size_ = (size_t)Schema::asEnum(&schema_local);
    EnumSchema::getEnumerants(&enumerants,(EnumSchema *)&structText);
    if (pBVar13 == (Branch *)0x1) {
      kj::StringTree::concat<>();
    }
    else {
      kj::
      strTree<char_const(&)[29],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[2],kj::StringPtr&,char_const(&)[4]>
                (&__return_storage_ptr__->outerTypeDecl,(kj *)"  typedef ::capnp::schemas::",
                 (char (*) [29])&name,(StringPtr *)0x229d78,(char (*) [2])&hexId,
                 (CappedArray<char,_17UL> *)0x229c0d,(char (*) [2])&name,(StringPtr *)0x22a50c,
                 (char (*) [4])CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    }
    if (pBVar13 == (Branch *)0x1) {
      kj::
      strTree<char_const(&)[27],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[2],kj::StringPtr&,char_const(&)[4]>
                (&__return_storage_ptr__->outerTypeDef,(kj *)0x22a17c,(char (*) [27])&name,
                 (StringPtr *)0x229d78,(char (*) [2])&hexId,(CappedArray<char,_17UL> *)0x229c0d,
                 (char (*) [2])&name,(StringPtr *)0x22a50c,
                 (char (*) [4])CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    }
    else {
      kj::StringTree::concat<>();
    }
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    capacity = enumerants.list.reader._24_8_ & 0xffffffff;
    pacVar32 = (char (*) [3])0x0;
    builder.ptr = (StringTree *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0x38,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    builder.endPtr = builder.ptr + capacity;
    builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder.pos = builder.ptr;
    if (enumerants.list.reader.elementCount != 0) {
      index = 0;
      pSVar17 = builder.endPtr;
      pcVar21 = local_3a8.text.content.ptr;
      sVar7 = local_3a8.text.content.size_;
      pBVar14 = local_3a8.branches.ptr;
      sVar8 = local_3a8.branches.size_;
      do {
        local_3a8.branches.size_ = sVar8;
        local_3a8.branches.ptr = pBVar14;
        local_3a8.text.content.size_ = sVar7;
        local_3a8.text.content.ptr = pcVar21;
        EVar1.super_Schema.raw = enumerants.parent.super_Schema.raw;
        this_00 = (CapnpcCppMain *)(local_c8 + 0x10);
        _::ListReader::getStructElement((StructReader *)this_00,&enumerants.list.reader,index);
        uVar3 = local_c8._8_8_;
        local_c8._0_8_ = EVar1.super_Schema.raw;
        local_c8._8_2_ = (short)index;
        uVar6 = local_c8._8_8_;
        structText.outerTypeDecl.branches.disposer = local_98;
        structText.outerTypeDef.size_ = sStack_90;
        structText.outerTypeDecl.branches.ptr = local_a8;
        structText.outerTypeDecl.branches.size_ = sStack_a0;
        structText.outerTypeDecl.text.content.size_ = local_c8._16_8_;
        structText.outerTypeDecl.text.content.disposer = pAStack_b0;
        structText.outerTypeDecl.size_ = (size_t)EVar1.super_Schema.raw;
        local_c8._10_4_ = SUB84(uVar3,2);
        local_c8._14_2_ = SUB82(uVar3,6);
        structText.outerTypeDecl.text.content.ptr =
             (char *)CONCAT26(local_c8._14_2_,CONCAT42(local_c8._10_4_,(short)index));
        proto_01._reader.capTable = (CapTableReader *)pAStack_b0;
        proto_01._reader.segment = (SegmentReader *)local_c8._16_8_;
        proto_01._reader.data = local_a8;
        proto_01._reader.pointers = (WirePointer *)sStack_a0;
        proto_01._reader._32_8_ = local_98;
        proto_01._reader._40_8_ = sStack_90;
        local_c8._8_8_ = uVar6;
        SVar27 = protoName<capnp::schema::Enumerant::Reader>(this_00,proto_01);
        name_00.content.ptr = (char *)SVar27.content.size_;
        name_00.content.size_ = (size_t)pSVar17;
        toUpperCase(&constType_3,(CapnpcCppMain *)SVar27.content.ptr,name_00);
        kj::strTree<char_const(&)[3],kj::String,char_const(&)[3]>
                  (&local_3a8,(kj *)0x229c0c,(char (*) [3])&constType_3,(String *)0x22b2b8,pacVar32)
        ;
        pacVar24 = (char (*) [3])constType_3.content.size_;
        pcVar21 = constType_3.content.ptr;
        if (constType_3.content.ptr != (char *)0x0) {
          constType_3.content.ptr = (char *)0x0;
          constType_3.content.size_ = 0;
          (**(constType_3.content.disposer)->_vptr_ArrayDisposer)
                    (constType_3.content.disposer,pcVar21,1,pacVar24,pacVar24,0);
          pacVar32 = pacVar24;
        }
        (builder.pos)->size_ = local_3a8.size_;
        ((builder.pos)->text).content.ptr = local_3a8.text.content.ptr;
        ((builder.pos)->text).content.size_ = local_3a8.text.content.size_;
        ((builder.pos)->text).content.disposer = local_3a8.text.content.disposer;
        local_3a8.text.content.ptr = (char *)0x0;
        pcVar21 = local_3a8.text.content.ptr;
        local_3a8.text.content.size_ = 0;
        sVar7 = local_3a8.text.content.size_;
        ((builder.pos)->branches).ptr = local_3a8.branches.ptr;
        ((builder.pos)->branches).size_ = local_3a8.branches.size_;
        ((builder.pos)->branches).disposer = local_3a8.branches.disposer;
        local_3a8.branches.ptr = (Branch *)0x0;
        pBVar14 = local_3a8.branches.ptr;
        local_3a8.branches.size_ = 0;
        sVar8 = local_3a8.branches.size_;
        builder.pos = builder.pos + 1;
        local_3a8.branches.size_ = 0;
        local_3a8.branches.ptr = (Branch *)0x0;
        local_3a8.text.content.size_ = 0;
        local_3a8.text.content.ptr = (char *)0x0;
        index = index + 1;
        pSVar17 = (StringTree *)local_3a8.branches.disposer;
      } while (index != enumerants.list.reader.elementCount);
    }
    result.size_ = ((long)builder.pos - (long)builder.ptr >> 3) * 0x6db6db6db6db6db7;
    result.ptr = builder.ptr;
    result.disposer = builder.disposer;
    kj::
    strTree<char_const(&)[12],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[14],kj::Array<kj::StringTree>,char_const(&)[23],kj::StringPtr&,char_const(&)[3],kj::CappedArray<char,17ul>&,char_const(&)[4]>
              (&__return_storage_ptr__->capnpSchemaDecls,(kj *)"enum class ",(char (*) [12])&name,
               (StringPtr *)0x229d78,(char (*) [2])&hexId,(CappedArray<char,_17UL> *)0x22a3ec,
               (char (*) [14])&result,(Array<kj::StringTree> *)"};\nCAPNP_DECLARE_ENUM(",
               (char (*) [23])&name,(StringPtr *)0x22b13e,(char (*) [3])&hexId,
               (CappedArray<char,_17UL> *)0x22b123,
               (char (*) [4])CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    kj::
    strTree<char_const(&)[19],kj::StringPtr&,char_const(&)[2],kj::CappedArray<char,17ul>&,char_const(&)[3],kj::CappedArray<char,17ul>&,char_const(&)[4]>
              (&__return_storage_ptr__->capnpSchemaDefs,(kj *)"CAPNP_DEFINE_ENUM(",
               (char (*) [19])&name,(StringPtr *)0x229d78,(char (*) [2])&hexId,
               (CappedArray<char,_17UL> *)0x22b13e,(char (*) [3])&hexId,
               (CappedArray<char,_17UL> *)0x22b123,
               (char (*) [4])CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    kj::StringTree::concat<>();
    sVar7 = result.size_;
    pSVar17 = result.ptr;
    if (result.ptr != (StringTree *)0x0) {
      result.ptr = (StringTree *)0x0;
      result.size_ = 0;
      (**(result.disposer)->_vptr_ArrayDisposer)
                (result.disposer,pSVar17,0x38,sVar7,sVar7,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    break;
  case 3:
    this->hasInterfaces = true;
    pAVar30 = (ArrayDisposer *)0x15fd83;
    schema_01 = Schema::asInterface(&schema_local);
    local_148 = *plVar25;
    lStack_140 = plVar25[1];
    local_138 = (undefined8 *)plVar25[2];
    *plVar25 = 0;
    plVar25[1] = 0;
    nestedTypeDecls_01.size_ = (size_t)schema.raw;
    nestedTypeDecls_01.ptr = (StringTree *)&local_148;
    nestedTypeDecls_01.disposer = pAVar30;
    makeInterfaceText((InterfaceText *)&structText,this,namespace_,SVar27,schema_01,
                      nestedTypeDecls_01,
                      (TemplateContext *)
                      CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
    lVar5 = lStack_140;
    lVar4 = local_148;
    if (local_148 != 0) {
      local_148 = 0;
      lStack_140 = 0;
      (**(code **)*local_138)
                (local_138,lVar4,0x38,lVar5,lVar5,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
    (__return_storage_ptr__->outerTypeDecl).size_ = structText.outerTypeDecl.size_;
    (__return_storage_ptr__->outerTypeDecl).text.content.ptr =
         structText.outerTypeDecl.text.content.ptr;
    (__return_storage_ptr__->outerTypeDecl).text.content.size_ =
         structText.outerTypeDecl.text.content.size_;
    (__return_storage_ptr__->outerTypeDecl).text.content.disposer =
         structText.outerTypeDecl.text.content.disposer;
    structText.outerTypeDecl.text.content.ptr = (char *)0x0;
    structText.outerTypeDecl.text.content.size_ = 0;
    (__return_storage_ptr__->outerTypeDecl).branches.ptr = structText.outerTypeDecl.branches.ptr;
    (__return_storage_ptr__->outerTypeDecl).branches.size_ = structText.outerTypeDecl.branches.size_
    ;
    (__return_storage_ptr__->outerTypeDecl).branches.disposer =
         structText.outerTypeDecl.branches.disposer;
    structText.outerTypeDecl.branches.ptr = (Branch *)0x0;
    structText.outerTypeDecl.branches.size_ = 0;
    (__return_storage_ptr__->outerTypeDef).size_ = structText.outerTypeDef.size_;
    (__return_storage_ptr__->outerTypeDef).text.content.ptr =
         structText.outerTypeDef.text.content.ptr;
    (__return_storage_ptr__->outerTypeDef).text.content.size_ =
         structText.outerTypeDef.text.content.size_;
    (__return_storage_ptr__->outerTypeDef).text.content.disposer =
         structText.outerTypeDef.text.content.disposer;
    structText.outerTypeDef.text.content.ptr = (char *)0x0;
    structText.outerTypeDef.text.content.size_ = 0;
    (__return_storage_ptr__->outerTypeDef).branches.ptr = structText.outerTypeDef.branches.ptr;
    (__return_storage_ptr__->outerTypeDef).branches.size_ = structText.outerTypeDef.branches.size_;
    (__return_storage_ptr__->outerTypeDef).branches.disposer =
         structText.outerTypeDef.branches.disposer;
    structText.outerTypeDef.branches.ptr = (Branch *)0x0;
    structText.outerTypeDef.branches.size_ = 0;
    (__return_storage_ptr__->readerBuilderDefs).size_ = structText.readerBuilderDefs.size_;
    (__return_storage_ptr__->readerBuilderDefs).text.content.ptr =
         structText.readerBuilderDefs.text.content.ptr;
    (__return_storage_ptr__->readerBuilderDefs).text.content.size_ =
         structText.readerBuilderDefs.text.content.size_;
    (__return_storage_ptr__->readerBuilderDefs).text.content.disposer =
         structText.readerBuilderDefs.text.content.disposer;
    structText.readerBuilderDefs.text.content.ptr = (char *)0x0;
    structText.readerBuilderDefs.text.content.size_ = 0;
    (__return_storage_ptr__->readerBuilderDefs).branches.ptr =
         structText.readerBuilderDefs.branches.ptr;
    (__return_storage_ptr__->readerBuilderDefs).branches.size_ =
         structText.readerBuilderDefs.branches.size_;
    (__return_storage_ptr__->readerBuilderDefs).branches.disposer =
         structText.readerBuilderDefs.branches.disposer;
    structText.readerBuilderDefs.branches.ptr = (Branch *)0x0;
    structText.readerBuilderDefs.branches.size_ = 0;
    (__return_storage_ptr__->inlineMethodDefs).size_ = structText.inlineMethodDefs.size_;
    (__return_storage_ptr__->inlineMethodDefs).text.content.ptr =
         structText.inlineMethodDefs.text.content.ptr;
    (__return_storage_ptr__->inlineMethodDefs).text.content.size_ =
         structText.inlineMethodDefs.text.content.size_;
    (__return_storage_ptr__->inlineMethodDefs).text.content.disposer =
         structText.inlineMethodDefs.text.content.disposer;
    structText.inlineMethodDefs.text.content.ptr = (char *)0x0;
    structText.inlineMethodDefs.text.content.size_ = 0;
    (__return_storage_ptr__->inlineMethodDefs).branches.ptr =
         structText.inlineMethodDefs.branches.ptr;
    (__return_storage_ptr__->inlineMethodDefs).branches.size_ =
         structText.inlineMethodDefs.branches.size_;
    (__return_storage_ptr__->inlineMethodDefs).branches.disposer =
         structText.inlineMethodDefs.branches.disposer;
    structText.inlineMethodDefs.branches.ptr = (Branch *)0x0;
    structText.inlineMethodDefs.branches.size_ = 0;
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    (__return_storage_ptr__->sourceFileDefs).size_ = structText.sourceDefs.size_;
    (__return_storage_ptr__->sourceFileDefs).text.content.ptr =
         structText.sourceDefs.text.content.ptr;
    (__return_storage_ptr__->sourceFileDefs).text.content.size_ =
         structText.sourceDefs.text.content.size_;
    (__return_storage_ptr__->sourceFileDefs).text.content.disposer =
         structText.sourceDefs.text.content.disposer;
    structText.sourceDefs.text.content.ptr = (char *)0x0;
    structText.sourceDefs.text.content.size_ = 0;
    (__return_storage_ptr__->sourceFileDefs).branches.ptr = structText.sourceDefs.branches.ptr;
    (__return_storage_ptr__->sourceFileDefs).branches.size_ = structText.sourceDefs.branches.size_;
    (__return_storage_ptr__->sourceFileDefs).branches.disposer =
         structText.sourceDefs.branches.disposer;
    structText.sourceDefs.branches.ptr = (Branch *)0x0;
    structText.sourceDefs.branches.size_ = 0;
    InterfaceText::~InterfaceText((InterfaceText *)&structText);
    break;
  case 4:
    pcVar21 = name.content.ptr;
    sVar7 = name.content.size_;
    local_470.raw = (RawBrandedSchema *)Schema::asConst(&schema_local);
    local_358 = namespace_.content.ptr;
    local_350 = pBVar13;
    Schema::getProto(&proto_1,&local_470);
    local_1b0._16_8_ = proto_1._reader.segment;
    type = ConstSchema::getType((ConstSchema *)&local_470);
    aVar19 = type.field_4;
    pAVar31 = (ArrayPtr<const_char> *)local_c8;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    typeName((CppTypeName *)&enumerants,this,type,(Maybe<capnp::InterfaceSchema::Method> *)pAVar31);
    SVar27.content.size_ = (size_t)aVar19.schema;
    SVar27.content.ptr = (char *)sVar7;
    toUpperCase(&upperCase,(CapnpcCppMain *)pcVar21,SVar27);
    linkage = "static ";
    if (local_350 == (Branch *)0x1) {
      linkage = "extern ";
    }
    WVar10 = LIST;
    if (type.listDepth == '\0') {
      WVar10 = type.baseType;
    }
    params_1 = &switchD_0015fd24::switchdataD_00229038;
    switch(WVar10) {
    case VOID:
    case FLOAT32:
    case FLOAT64:
      TVar26 = ConstSchema::getType((ConstSchema *)&local_470);
      if (proto_1._reader.pointerCount < 5) {
        proto_1._reader.capTable = (CapTableReader *)0x0;
        constType_3.content.disposer = (ArrayDisposer *)0x0;
        constType_3.content.ptr = (char *)0x0;
      }
      else {
        constType_3.content.disposer = (ArrayDisposer *)(proto_1._reader.pointers + 4);
        constType_3.content.ptr = (char *)local_1b0._16_8_;
      }
      constType_3.content.size_ = (size_t)proto_1._reader.capTable;
      _::PointerReader::getStruct
                ((StructReader *)&builder,(PointerReader *)&constType_3,(word *)0x0);
      value_00._reader.capTable = (CapTableReader *)builder.pos;
      value_00._reader.segment = (SegmentReader *)builder.ptr;
      value_00._reader.data = builder.endPtr;
      value_00._reader.pointers = (WirePointer *)builder.disposer;
      value_00._reader._32_8_ = pBStack_3c8;
      value_00._reader._40_8_ = sStack_3c0;
      literalValue(&local_3a8,this,TVar26,value_00);
      kj::StringTree::flatten((String *)&result,&local_3a8);
      sVar7 = local_3a8.branches.size_;
      pBVar14 = local_3a8.branches.ptr;
      pCVar20 = extraout_RDX_01;
      if (local_3a8.branches.ptr != (Branch *)0x0) {
        local_3a8.branches.ptr = (Branch *)0x0;
        local_3a8.branches.size_ = 0;
        (**(local_3a8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.branches.disposer,pBVar14,0x40,sVar7,sVar7,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        pCVar20 = extraout_RDX_02;
      }
      sVar7 = local_3a8.text.content.size_;
      pcVar21 = local_3a8.text.content.ptr;
      if ((StringTree *)local_3a8.text.content.ptr != (StringTree *)0x0) {
        local_3a8.text.content.ptr = (char *)0x0;
        local_3a8.text.content.size_ = 0;
        (**(local_3a8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.text.content.disposer,pcVar21,1,sVar7,sVar7,0);
        pCVar20 = extraout_RDX_03;
      }
      structText.outerTypeDecl.size_ = structText.outerTypeDecl.size_ & 0xffffffffffffff00;
      constType_3.content.ptr = "static KJ_CONSTEXPR(const) ";
      constType_3.content.size_ = 0x1b;
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&local_3a8,(kj *)&enumerants,pCVar20);
      local_108[0] = 0x20;
      constType.content.ptr = (char *)upperCase.content.size_;
      if (upperCase.content.size_ != 0) {
        constType.content.ptr = upperCase.content.ptr;
      }
      constType.content.size_ = (size_t)(upperCase.content.size_ - 1);
      if (upperCase.content.size_ == 0) {
        constType.content.size_ = (size_t)(char *)0x0;
      }
      local_348._0_8_ = " CAPNP_NON_INT_CONSTEXPR_DECL_INIT(";
      local_348._8_8_ = (char *)0x23;
      local_2d8._0_8_ = result.size_;
      if (result.size_ != 0) {
        local_2d8._0_8_ = result.ptr;
      }
      local_2d8._8_8_ = (char *)(result.size_ - 1);
      if (result.size_ == 0) {
        local_2d8._8_8_ = (char *)0x0;
      }
      local_1b0._0_8_ = ");\n";
      local_1b0._8_8_ = (char *)0x3;
      params_1 = (uint *)local_108;
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((StringTree *)&structText.outerTypeDecl.text,(StringTree *)&constType_3,
                 (ArrayPtr<const_char> *)&local_3a8,(String *)local_108,
                 (FixedArray<char,_1UL> *)&constType,(ArrayPtr<const_char> *)local_348,
                 (ArrayPtr<const_char> *)local_2d8,(ArrayPtr<const_char> *)local_1b0,
                 (ArrayPtr<const_char> *)
                 CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
      pSVar17 = (StringTree *)local_3a8.text.content.ptr;
      sVar7 = local_3a8.size_;
      pCVar20 = extraout_RDX_04;
      if (local_3a8.size_ != 0) {
        local_3a8.size_ = 0;
        local_3a8.text.content.ptr = (char *)0x0;
        (**(code **)((Array<char> *)local_3a8.text.content.size_)->ptr)
                  (local_3a8.text.content.size_,sVar7,1,pSVar17,pSVar17,0);
        params_1 = (uint *)pSVar17;
        pCVar20 = extraout_RDX_05;
      }
      if (local_350 == (Branch *)0x1) {
        kj::StringTree::concat<>();
      }
      else {
        constType_3.content.ptr = "KJ_CONSTEXPR(const) ";
        constType_3.content.size_ = 0x14;
        pAVar31 = (ArrayPtr<const_char> *)0x160a49;
        kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                  ((String *)&local_3a8,(kj *)&enumerants,pCVar20);
        constType.content.size_ = (long)&local_350[-1].content.branches.disposer + 7;
        constType.content.ptr = local_358;
        local_348._0_8_ = upperCase.content.size_;
        if (upperCase.content.size_ != 0) {
          local_348._0_8_ = upperCase.content.ptr;
        }
        local_348._8_8_ = (char *)(upperCase.content.size_ - 1);
        if (upperCase.content.size_ == 0) {
          local_348._8_8_ = (char *)0x0;
        }
        local_2d8._0_8_ = " CAPNP_NON_INT_CONSTEXPR_DEF_INIT(";
        local_2d8._8_8_ = (char *)0x22;
        local_1b0._0_8_ = result.size_;
        if (result.size_ != 0) {
          local_1b0._0_8_ = result.ptr;
        }
        local_1b0._8_8_ = (char *)(result.size_ - 1);
        if (result.size_ == 0) {
          local_1b0._8_8_ = (char *)0x0;
        }
        local_108._0_8_ = ");\n";
        local_108._8_8_ = (char *)0x3;
        params_1 = (uint *)&stack0xfffffffffffffb7f;
        kj::StringTree::
        concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((StringTree *)&structText.outerTypeDef.text,(StringTree *)&constType_3,
                   (ArrayPtr<const_char> *)&local_3a8,(String *)params_1,
                   (FixedArray<char,_1UL> *)&constType,(ArrayPtr<const_char> *)local_348,
                   (ArrayPtr<const_char> *)local_2d8,(ArrayPtr<const_char> *)local_1b0,
                   (ArrayPtr<const_char> *)local_108,pAVar31);
        pSVar17 = (StringTree *)local_3a8.text.content.ptr;
        sVar7 = local_3a8.size_;
        if (local_3a8.size_ != 0) {
          local_3a8.size_ = 0;
          local_3a8.text.content.ptr = (char *)0x0;
          (**(code **)((Array<char> *)local_3a8.text.content.size_)->ptr)
                    (local_3a8.text.content.size_,sVar7,1,pSVar17,pSVar17,0);
          params_1 = (uint *)pSVar17;
        }
      }
      pSVar15 = (StringTree *)result.size_;
      pSVar17 = result.ptr;
      if (result.ptr != (StringTree *)0x0) {
        result.ptr = (StringTree *)0x0;
        result.size_ = 0;
        (**(result.disposer)->_vptr_ArrayDisposer)(result.disposer,pSVar17,1,pSVar15,pSVar15,0);
        params_1 = (uint *)pSVar15;
      }
      break;
    case BOOL:
    case INT8:
    case INT16:
    case INT32:
    case INT64:
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
    case ENUM:
      structText.outerTypeDecl.size_ = (ulong)structText.outerTypeDecl.size_._1_7_ << 8;
      TVar26 = ConstSchema::getType((ConstSchema *)&local_470);
      if (proto_1._reader.pointerCount < 5) {
        proto_1._reader.capTable = (CapTableReader *)0x0;
        constType_3.content.disposer = (ArrayDisposer *)0x0;
        constType_3.content.ptr = (char *)0x0;
      }
      else {
        constType_3.content.disposer = (ArrayDisposer *)(proto_1._reader.pointers + 4);
        constType_3.content.ptr = (char *)local_1b0._16_8_;
      }
      constType_3.content.size_ = (size_t)proto_1._reader.capTable;
      _::PointerReader::getStruct
                ((StructReader *)&builder,(PointerReader *)&constType_3,(word *)0x0);
      value._reader.capTable = (CapTableReader *)builder.pos;
      value._reader.segment = (SegmentReader *)builder.ptr;
      value._reader.data = builder.endPtr;
      value._reader.pointers = (WirePointer *)builder.disposer;
      value._reader._32_8_ = pBStack_3c8;
      value._reader._40_8_ = sStack_3c0;
      literalValue(&local_3a8,this,TVar26,value);
      result.ptr = (StringTree *)anon_var_dwarf_8467f;
      result.size_ = 0x11;
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                (&constType_3,(kj *)&enumerants,value_02);
      local_1b0[0] = 0x20;
      constType.content.ptr = (char *)upperCase.content.size_;
      if (upperCase.content.size_ != 0) {
        constType.content.ptr = upperCase.content.ptr;
      }
      constType.content.size_ = 0;
      if (upperCase.content.size_ != 0) {
        constType.content.size_ = upperCase.content.size_ - 1;
      }
      local_348._0_8_ = " = ";
      local_348._8_8_ = (char *)0x3;
      local_2d8._0_8_ = ";\n";
      local_2d8._8_8_ = (char *)0x2;
      params_1 = (uint *)local_1b0;
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
                ((StringTree *)&structText.outerTypeDecl.text,(StringTree *)&result,
                 (ArrayPtr<const_char> *)&constType_3,(String *)params_1,
                 (FixedArray<char,_1UL> *)&constType,(ArrayPtr<const_char> *)local_348,
                 (ArrayPtr<const_char> *)&local_3a8,(StringTree *)local_2d8,
                 (ArrayPtr<const_char> *)
                 CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78));
      pSVar17 = (StringTree *)constType_3.content.size_;
      pcVar21 = constType_3.content.ptr;
      pCVar20 = extraout_RDX;
      if (constType_3.content.ptr != (char *)0x0) {
        constType_3.content.ptr = (char *)0x0;
        constType_3.content.size_ = 0;
        (**(constType_3.content.disposer)->_vptr_ArrayDisposer)
                  (constType_3.content.disposer,pcVar21,1,pSVar17,pSVar17,0);
        params_1 = (uint *)pSVar17;
        pCVar20 = extraout_RDX_00;
      }
      if (local_350 == (Branch *)0x1) {
        kj::StringTree::concat<>();
      }
      else {
        result.ptr = (StringTree *)anon_var_dwarf_84697;
        result.size_ = 0x1b;
        pAVar31 = (ArrayPtr<const_char> *)0x160636;
        kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                  (&constType_3,(kj *)&enumerants,pCVar20);
        local_1b0[0] = 0x20;
        constType.content.size_ = (long)&local_350[-1].content.branches.disposer + 7;
        constType.content.ptr = local_358;
        local_348._0_8_ = upperCase.content.size_;
        if (upperCase.content.size_ != 0) {
          local_348._0_8_ = upperCase.content.ptr;
        }
        local_348._8_8_ = (char *)0x0;
        if (upperCase.content.size_ != 0) {
          local_348._8_8_ = (char *)(upperCase.content.size_ - 1);
        }
        local_2d8._0_8_ = ";\n#endif\n";
        local_2d8._8_8_ = (char *)0x9;
        params_1 = (uint *)local_1b0;
        kj::StringTree::
        concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((StringTree *)&structText.outerTypeDef.text,(StringTree *)&result,
                   (ArrayPtr<const_char> *)&constType_3,(String *)params_1,
                   (FixedArray<char,_1UL> *)&constType,(ArrayPtr<const_char> *)local_348,
                   (ArrayPtr<const_char> *)local_2d8,pAVar31);
        pSVar17 = (StringTree *)constType_3.content.size_;
        pcVar21 = constType_3.content.ptr;
        if (constType_3.content.ptr != (char *)0x0) {
          constType_3.content.ptr = (char *)0x0;
          constType_3.content.size_ = 0;
          (**(constType_3.content.disposer)->_vptr_ArrayDisposer)
                    (constType_3.content.disposer,pcVar21,1,pSVar17,pSVar17,0);
          params_1 = (uint *)pSVar17;
        }
      }
      pSVar17 = (StringTree *)local_3a8.branches.size_;
      pBVar14 = local_3a8.branches.ptr;
      if (local_3a8.branches.ptr != (Branch *)0x0) {
        local_3a8.branches.ptr = (Branch *)0x0;
        local_3a8.branches.size_ = 0;
        (**(local_3a8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.branches.disposer,pBVar14,0x40,pSVar17,pSVar17,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
        params_1 = (uint *)pSVar17;
      }
      pSVar17 = (StringTree *)local_3a8.text.content.size_;
      pcVar21 = local_3a8.text.content.ptr;
      if ((StringTree *)local_3a8.text.content.ptr != (StringTree *)0x0) {
        local_3a8.text.content.ptr = (char *)0x0;
        local_3a8.text.content.size_ = 0;
        (**(local_3a8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.text.content.disposer,pcVar21,1,pSVar17,pSVar17,0);
        params_1 = (uint *)pSVar17;
      }
      break;
    case TEXT:
      RVar28 = ConstSchema::as<capnp::Text>((ConstSchema *)&local_470);
      constType_3.content.ptr = (char *)(RVar28.super_StringPtr.content.size_ - 1);
      kj::strTree<char_const(&)[23],unsigned_long,char_const(&)[2]>
                (&local_3a8,(kj *)"::capnp::_::ConstText<",(char (*) [23])&constType_3,
                 (unsigned_long *)0x234c9a,(char (*) [2])pAVar31);
      pacVar32 = (char (*) [3])0x160c7a;
      kj::StringTree::flatten((String *)&builder,&local_3a8);
      sVar7 = local_3a8.branches.size_;
      pBVar14 = local_3a8.branches.ptr;
      if (local_3a8.branches.ptr != (Branch *)0x0) {
        local_3a8.branches.ptr = (Branch *)0x0;
        local_3a8.branches.size_ = 0;
        pacVar32 = (char (*) [3])0x160cb1;
        (**(local_3a8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.branches.disposer,pBVar14,0x40,sVar7,sVar7,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar7 = local_3a8.text.content.size_;
      pcVar21 = local_3a8.text.content.ptr;
      if ((StringTree *)local_3a8.text.content.ptr != (StringTree *)0x0) {
        local_3a8.text.content.ptr = (char *)0x0;
        local_3a8.text.content.size_ = 0;
        pacVar32 = (char (*) [3])0x160ce4;
        (**(local_3a8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.text.content.disposer,pcVar21,1,sVar7,sVar7,0);
      }
      structText.outerTypeDecl.size_ = CONCAT71(structText.outerTypeDecl.size_._1_7_,1);
      result.ptr = (StringTree *)CONCAT71(result.ptr._1_7_,0x20);
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&structText.outerTypeDecl.text,(kj *)&linkage,(char **)0x22adcb,
                 (char (*) [7])&builder,(String *)&result,(char *)&upperCase,(String *)0x22b124,
                 pacVar32);
      constType.content.ptr = (char *)CONCAT71(constType.content.ptr._1_7_,0x20);
      if (proto_1._reader.dataSize < 0x40) {
        uVar22 = 0;
      }
      else {
        uVar22 = *proto_1._reader.data;
      }
      kj::hex((CappedArray<char,_17UL> *)&local_3a8,uVar22);
      pacVar33 = (char (*) [4])0x161236;
      uVar11 = ConstSchema::getValueSchemaOffset((ConstSchema *)&local_470);
      constType_3.content.ptr = (char *)CONCAT44(constType_3.content.ptr._4_4_,uVar11);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)&structText.outerTypeDef.text,(kj *)0x22adcb,(char (*) [7])&builder,
                 (String *)params_1,(char *)&local_358,(StringPtr *)&upperCase,
                 (String *)"(::capnp::schemas::b_",(char (*) [22])&local_3a8,
                 (CappedArray<char,_17UL> *)".words + ",(char (*) [10])&constType_3,(uint *)0x22b123
                 ,pacVar33);
      pRVar16 = builder.pos;
      pSVar17 = builder.ptr;
      if (builder.ptr != (StringTree *)0x0) {
        builder.ptr = (StringTree *)0x0;
        builder.pos = (RemoveConst<kj::StringTree> *)0x0;
        (**(code **)(builder.endPtr)->size_)(builder.endPtr,pSVar17,1,pRVar16,pRVar16,0);
        params_1 = (uint *)pRVar16;
      }
      break;
    case DATA:
      RVar29 = ConstSchema::as<capnp::Data>((ConstSchema *)&local_470);
      constType_3.content.ptr = (char *)RVar29.super_ArrayPtr<const_unsigned_char>.size_;
      kj::strTree<char_const(&)[23],unsigned_long,char_const(&)[2]>
                (&local_3a8,(kj *)"::capnp::_::ConstData<",(char (*) [23])&constType_3,
                 (unsigned_long *)0x234c9a,(char (*) [2])pAVar31);
      pacVar32 = (char (*) [3])0x160d92;
      kj::StringTree::flatten((String *)&builder,&local_3a8);
      sVar7 = local_3a8.branches.size_;
      pBVar14 = local_3a8.branches.ptr;
      if (local_3a8.branches.ptr != (Branch *)0x0) {
        local_3a8.branches.ptr = (Branch *)0x0;
        local_3a8.branches.size_ = 0;
        pacVar32 = (char (*) [3])0x160dc9;
        (**(local_3a8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.branches.disposer,pBVar14,0x40,sVar7,sVar7,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar7 = local_3a8.text.content.size_;
      pcVar21 = local_3a8.text.content.ptr;
      if ((StringTree *)local_3a8.text.content.ptr != (StringTree *)0x0) {
        local_3a8.text.content.ptr = (char *)0x0;
        local_3a8.text.content.size_ = 0;
        pacVar32 = (char (*) [3])0x160dfc;
        (**(local_3a8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.text.content.disposer,pcVar21,1,sVar7,sVar7,0);
      }
      structText.outerTypeDecl.size_ = CONCAT71(structText.outerTypeDecl.size_._1_7_,1);
      result.ptr = (StringTree *)CONCAT71(result.ptr._1_7_,0x20);
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&structText.outerTypeDecl.text,(kj *)&linkage,(char **)0x22adcb,
                 (char (*) [7])&builder,(String *)&result,(char *)&upperCase,(String *)0x22b124,
                 pacVar32);
      constType.content.ptr = (char *)CONCAT71(constType.content.ptr._1_7_,0x20);
      if (proto_1._reader.dataSize < 0x40) {
        uVar22 = 0;
      }
      else {
        uVar22 = *proto_1._reader.data;
      }
      kj::hex((CappedArray<char,_17UL> *)&local_3a8,uVar22);
      pacVar33 = (char (*) [4])0x1612f7;
      uVar11 = ConstSchema::getValueSchemaOffset((ConstSchema *)&local_470);
      constType_3.content.ptr = (char *)CONCAT44(constType_3.content.ptr._4_4_,uVar11);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)&structText.outerTypeDef.text,(kj *)0x22adcb,(char (*) [7])&builder,
                 (String *)params_1,(char *)&local_358,(StringPtr *)&upperCase,
                 (String *)"(::capnp::schemas::b_",(char (*) [22])&local_3a8,
                 (CappedArray<char,_17UL> *)".words + ",(char (*) [10])&constType_3,(uint *)0x22b123
                 ,pacVar33);
      pRVar16 = builder.pos;
      pSVar17 = builder.ptr;
      if (builder.ptr != (StringTree *)0x0) {
        builder.ptr = (StringTree *)0x0;
        builder.pos = (RemoveConst<kj::StringTree> *)0x0;
        (**(code **)(builder.endPtr)->size_)(builder.endPtr,pSVar17,1,pRVar16,pRVar16,0);
        params_1 = (uint *)pRVar16;
      }
      break;
    case LIST:
      TVar26 = (Type)Type::asList(&type);
      aVar19 = TVar26.field_4;
      pSVar17 = &local_3a8;
      local_3a8.size_ = local_3a8.size_ & 0xffffffffffffff00;
      typeName((CppTypeName *)&builder,this,TVar26,(Maybe<capnp::InterfaceSchema::Method> *)pSVar17)
      ;
      local_2d8._0_8_ = "::capnp::_::ConstList<";
      local_2d8._8_8_ = (char *)0x16;
      if (local_3af == true) {
        local_348._0_8_ = "typename ";
        local_348._8_8_ = (char *)0x9;
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                  ((StringTree *)&constType_3,(StringTree *)local_348,
                   (ArrayPtr<const_char> *)&builder,(StringTree *)aVar19.schema);
      }
      else {
        constType_3.content.ptr = (char *)builder.ptr;
        constType_3.content.size_ = (size_t)builder.pos;
        constType_3.content.disposer = (ArrayDisposer *)builder.endPtr;
        local_430 = builder.disposer;
        pBStack_428 = pBStack_3c8;
        builder.pos = (RemoveConst<kj::StringTree> *)0x0;
        builder.endPtr = (StringTree *)0x0;
        sStack_420 = sStack_3c0;
        pAStack_418 = local_3b8;
        pBStack_3c8 = (Branch *)0x0;
        sStack_3c0 = 0;
      }
      local_348._0_8_ = ">";
      local_348._8_8_ = (char *)0x1;
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
                ((StringTree *)&result,(StringTree *)local_2d8,(ArrayPtr<const_char> *)&constType_3,
                 (StringTree *)local_348,(ArrayPtr<const_char> *)pSVar17);
      if (pBStack_428 != (Branch *)0x0) {
        (**pAStack_418->_vptr_ArrayDisposer)
                  (pAStack_418,pBStack_428,0x40,sStack_420,sStack_420,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      pAVar30 = constType_3.content.disposer;
      sVar7 = constType_3.content.size_;
      if (constType_3.content.size_ != 0) {
        constType_3.content.size_ = 0;
        constType_3.content.disposer = (ArrayDisposer *)0x0;
        (**local_430->_vptr_ArrayDisposer)(local_430,sVar7,1,pAVar30,pAVar30,0);
      }
      pacVar32 = (char (*) [3])0x1610d4;
      kj::StringTree::flatten(&constType,(StringTree *)&result);
      if (local_318 != (Branch *)0x0) {
        pacVar32 = (char (*) [3])0x16110b;
        (**local_308->_vptr_ArrayDisposer)
                  (local_308,local_318,0x40,sStack_310,sStack_310,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      pAVar30 = result.disposer;
      sVar7 = result.size_;
      if (result.size_ != 0) {
        result.size_ = 0;
        result.disposer = (ArrayDisposer *)0x0;
        pacVar32 = (char (*) [3])0x16113e;
        (**local_320->_vptr_ArrayDisposer)(local_320,sVar7,1,pAVar30,pAVar30,0);
      }
      if (pBStack_3c8 != (Branch *)0x0) {
        pacVar32 = (char (*) [3])0x161175;
        (**local_3b8->_vptr_ArrayDisposer)
                  (local_3b8,pBStack_3c8,0x40,sStack_3c0,sStack_3c0,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      pSVar17 = builder.endPtr;
      pRVar16 = builder.pos;
      if (builder.pos != (RemoveConst<kj::StringTree> *)0x0) {
        builder.pos = (RemoveConst<kj::StringTree> *)0x0;
        builder.endPtr = (StringTree *)0x0;
        pacVar32 = (char (*) [3])0x1611a8;
        (**(builder.disposer)->_vptr_ArrayDisposer)(builder.disposer,pRVar16,1,pSVar17,pSVar17,0);
      }
      structText.outerTypeDecl.size_ = CONCAT71(structText.outerTypeDecl.size_._1_7_,1);
      result.ptr = (StringTree *)CONCAT71(result.ptr._1_7_,0x20);
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&structText.outerTypeDecl.text,(kj *)&linkage,(char **)0x22adcb,
                 (char (*) [7])&constType,(String *)&result,(char *)&upperCase,(String *)0x22b124,
                 pacVar32);
      local_348[0] = 0x20;
      if (proto_1._reader.dataSize < 0x40) {
        uVar22 = 0;
      }
      else {
        uVar22 = *proto_1._reader.data;
      }
      kj::hex((CappedArray<char,_17UL> *)&builder,uVar22);
      pacVar33 = (char (*) [4])0x16146d;
      uVar11 = ConstSchema::getValueSchemaOffset((ConstSchema *)&local_470);
      constType_3.content.ptr = (char *)CONCAT44(constType_3.content.ptr._4_4_,uVar11);
      params_1 = (uint *)local_348;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)&structText.outerTypeDef.text,(kj *)0x22adcb,(char (*) [7])&constType
                 ,(String *)params_1,(char *)&local_358,(StringPtr *)&upperCase,
                 (String *)"(::capnp::schemas::b_",(char (*) [22])&builder,
                 (CappedArray<char,_17UL> *)".words + ",(char (*) [10])&constType_3,(uint *)0x22b123
                 ,pacVar33);
      pSVar17 = (StringTree *)constType.content.size_;
      pcVar21 = constType.content.ptr;
      if (constType.content.ptr != (char *)0x0) {
        constType.content.ptr = (char *)0x0;
        constType.content.size_ = 0;
        (**(constType.content.disposer)->_vptr_ArrayDisposer)
                  (constType.content.disposer,pcVar21,1,pSVar17,pSVar17,0);
        params_1 = (uint *)pSVar17;
      }
      break;
    case STRUCT:
      result.ptr = (StringTree *)anon_var_dwarf_8471b;
      result.size_ = 0x18;
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&builder,(kj *)&enumerants,value_01);
      constType.content.ptr = ">";
      constType.content.size_ = 1;
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
                (&local_3a8,(StringTree *)&result,(ArrayPtr<const_char> *)&builder,&constType,
                 pAVar31);
      pRVar16 = builder.pos;
      pSVar17 = builder.ptr;
      if (builder.ptr != (StringTree *)0x0) {
        builder.ptr = (StringTree *)0x0;
        builder.pos = (RemoveConst<kj::StringTree> *)0x0;
        (**(code **)(builder.endPtr)->size_)(builder.endPtr,pSVar17,1,pRVar16,pRVar16,0);
      }
      pacVar32 = (char (*) [3])0x160f16;
      kj::StringTree::flatten(&constType_3,&local_3a8);
      sVar7 = local_3a8.branches.size_;
      pBVar14 = local_3a8.branches.ptr;
      if (local_3a8.branches.ptr != (Branch *)0x0) {
        local_3a8.branches.ptr = (Branch *)0x0;
        local_3a8.branches.size_ = 0;
        pacVar32 = (char (*) [3])0x160f4d;
        (**(local_3a8.branches.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.branches.disposer,pBVar14,0x40,sVar7,sVar7,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar7 = local_3a8.text.content.size_;
      pcVar21 = local_3a8.text.content.ptr;
      if ((StringTree *)local_3a8.text.content.ptr != (StringTree *)0x0) {
        local_3a8.text.content.ptr = (char *)0x0;
        local_3a8.text.content.size_ = 0;
        pacVar32 = (char (*) [3])0x160f80;
        (**(local_3a8.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_3a8.text.content.disposer,pcVar21,1,sVar7,sVar7,0);
      }
      structText.outerTypeDecl.size_ = CONCAT71(structText.outerTypeDecl.size_._1_7_,1);
      result.ptr = (StringTree *)CONCAT71(result.ptr._1_7_,0x20);
      kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
                ((StringTree *)&structText.outerTypeDecl.text,(kj *)&linkage,(char **)0x22adcb,
                 (char (*) [7])&constType_3,(String *)&result,(char *)&upperCase,(String *)0x22b124,
                 pacVar32);
      constType.content.ptr = (char *)CONCAT71(constType.content.ptr._1_7_,0x20);
      if (proto_1._reader.dataSize < 0x40) {
        uVar22 = 0;
      }
      else {
        uVar22 = *proto_1._reader.data;
      }
      kj::hex((CappedArray<char,_17UL> *)&local_3a8,uVar22);
      pacVar33 = (char (*) [4])0x1613b8;
      uVar11 = ConstSchema::getValueSchemaOffset((ConstSchema *)&local_470);
      builder.ptr = (StringTree *)CONCAT44(builder.ptr._4_4_,uVar11);
      params_1 = (uint *)&constType;
      kj::
      strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((StringTree *)&structText.outerTypeDef.text,(kj *)0x22adcb,
                 (char (*) [7])&constType_3,(String *)params_1,(char *)&local_358,
                 (StringPtr *)&upperCase,(String *)"(::capnp::schemas::b_",(char (*) [22])&local_3a8
                 ,(CappedArray<char,_17UL> *)".words + ",(char (*) [10])&builder,(uint *)0x22b123,
                 pacVar33);
      pSVar17 = (StringTree *)constType_3.content.size_;
      pcVar21 = constType_3.content.ptr;
      if (constType_3.content.ptr != (char *)0x0) {
        constType_3.content.ptr = (char *)0x0;
        constType_3.content.size_ = 0;
        (**(constType_3.content.disposer)->_vptr_ArrayDisposer)
                  (constType_3.content.disposer,pcVar21,1,pSVar17,pSVar17,0);
        params_1 = (uint *)pSVar17;
      }
      break;
    case INTERFACE:
    case ANY_POINTER:
      structText.outerTypeDecl.size_ = (ulong)structText.outerTypeDecl.size_._1_7_ << 8;
      kj::StringTree::concat<>();
      kj::StringTree::concat<>();
      break;
    default:
      kj::_::unreachable();
    }
    pSVar17 = (StringTree *)upperCase.content.size_;
    pcVar21 = upperCase.content.ptr;
    if (upperCase.content.ptr != (char *)0x0) {
      upperCase.content.ptr = (char *)0x0;
      upperCase.content.size_ = 0;
      (**(upperCase.content.disposer)->_vptr_ArrayDisposer)
                (upperCase.content.disposer,pcVar21,1,pSVar17,pSVar17,0);
      params_1 = (uint *)pSVar17;
    }
    pSVar17 = (StringTree *)enumerants.list.reader._32_8_;
    uVar3 = enumerants.list.reader._24_8_;
    if (enumerants.list.reader._24_8_ != 0) {
      enumerants.list.reader.elementCount = 0;
      enumerants.list.reader.step = 0;
      enumerants.list.reader.structDataSize = 0;
      enumerants.list.reader.structPointerCount = 0;
      enumerants.list.reader.elementSize = VOID;
      enumerants.list.reader._39_1_ = 0;
      (*(code *)**(undefined8 **)enumerants.list.reader._40_8_)
                (enumerants.list.reader._40_8_,uVar3,0x40,pSVar17,pSVar17,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      params_1 = (uint *)pSVar17;
    }
    pSVar17 = (StringTree *)enumerants.list.reader.capTable;
    pSVar2 = enumerants.list.reader.segment;
    if (enumerants.list.reader.segment != (SegmentReader *)0x0) {
      enumerants.list.reader.segment = (SegmentReader *)0x0;
      enumerants.list.reader.capTable = (CapTableReader *)0x0;
      (*(code *)**(undefined8 **)enumerants.list.reader.ptr)
                (enumerants.list.reader.ptr,pSVar2,1,pSVar17,pSVar17,0);
      params_1 = (uint *)pSVar17;
    }
    if (pBVar13 == (Branch *)0x1) {
      kj::StringTree::concat<>();
      (__return_storage_ptr__->outerTypeDef).size_ =
           (size_t)structText.outerTypeDecl.text.content.ptr;
      (__return_storage_ptr__->outerTypeDef).text.content.ptr =
           (char *)structText.outerTypeDecl.text.content.size_;
      (__return_storage_ptr__->outerTypeDef).text.content.size_ =
           (size_t)structText.outerTypeDecl.text.content.disposer;
      (__return_storage_ptr__->outerTypeDef).text.content.disposer =
           (ArrayDisposer *)structText.outerTypeDecl.branches.ptr;
      structText.outerTypeDecl.text.content.size_ = 0;
      structText.outerTypeDecl.text.content.disposer = (ArrayDisposer *)0x0;
      (__return_storage_ptr__->outerTypeDef).branches.ptr =
           (Branch *)structText.outerTypeDecl.branches.size_;
      (__return_storage_ptr__->outerTypeDef).branches.size_ =
           (size_t)structText.outerTypeDecl.branches.disposer;
      (__return_storage_ptr__->outerTypeDef).branches.disposer =
           (ArrayDisposer *)structText.outerTypeDef.size_;
      structText.outerTypeDecl.branches.size_ = 0;
      structText.outerTypeDecl.branches.disposer = (ArrayDisposer *)0x0;
    }
    else {
      local_c8._0_8_ = "  ";
      local_c8._8_8_ = (char *)0x2;
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                (&__return_storage_ptr__->outerTypeDecl,(StringTree *)local_c8,
                 (ArrayPtr<const_char> *)&structText.outerTypeDecl.text,(StringTree *)params_1);
      kj::StringTree::concat<>();
    }
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    (__return_storage_ptr__->sourceFileDefs).size_ =
         (size_t)structText.outerTypeDef.text.content.ptr;
    (__return_storage_ptr__->sourceFileDefs).text.content.ptr =
         (char *)structText.outerTypeDef.text.content.size_;
    (__return_storage_ptr__->sourceFileDefs).text.content.size_ =
         (size_t)structText.outerTypeDef.text.content.disposer;
    (__return_storage_ptr__->sourceFileDefs).text.content.disposer =
         (ArrayDisposer *)structText.outerTypeDef.branches.ptr;
    structText.outerTypeDef.text.content.size_ = 0;
    structText.outerTypeDef.text.content.disposer = (ArrayDisposer *)0x0;
    (__return_storage_ptr__->sourceFileDefs).branches.ptr =
         (Branch *)structText.outerTypeDef.branches.size_;
    (__return_storage_ptr__->sourceFileDefs).branches.size_ =
         (size_t)structText.outerTypeDef.branches.disposer;
    (__return_storage_ptr__->sourceFileDefs).branches.disposer =
         (ArrayDisposer *)structText.readerBuilderDefs.size_;
    structText.outerTypeDef.branches.size_ = 0;
    structText.outerTypeDef.branches.disposer = (ArrayDisposer *)0x0;
    ConstText::~ConstText((ConstText *)&structText);
    break;
  case 5:
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    kj::StringTree::concat<>();
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

NodeText makeNodeTextWithoutNested(kj::StringPtr namespace_, kj::StringPtr scope,
                                     kj::StringPtr name, Schema schema,
                                     kj::Array<kj::StringTree> nestedTypeDecls,
                                     const TemplateContext& templateContext) {
    auto proto = schema.getProto();
    KJ_IF_MAYBE(annotatedName, annotationValue(proto, NAME_ANNOTATION_ID)) {
      name = annotatedName->getText();
    }
    auto hexId = kj::hex(proto.getId());

    switch (proto.which()) {
      case schema::Node::FILE:
        KJ_FAIL_REQUIRE("This method shouldn't be called on file nodes.");

      case schema::Node::STRUCT: {
        StructText structText =
            makeStructText(scope, name, schema.asStruct(), kj::mv(nestedTypeDecls),
                           templateContext);

        return NodeText {
          kj::mv(structText.outerTypeDecl),
          kj::mv(structText.outerTypeDef),
          kj::mv(structText.readerBuilderDefs),
          kj::mv(structText.inlineMethodDefs),

          kj::strTree(),
          kj::strTree(),

          kj::mv(structText.sourceDefs),
        };
      }

      case schema::Node::ENUM: {
        auto enumerants = schema.asEnum().getEnumerants();

        return NodeText {
          scope.size() == 0 ? kj::strTree() : kj::strTree(
              "  typedef ::capnp::schemas::", name, "_", hexId, " ", name, ";\n"
              "\n"),

          scope.size() > 0 ? kj::strTree() : kj::strTree(
              "typedef ::capnp::schemas::", name, "_", hexId, " ", name, ";\n"
              "\n"),

          kj::strTree(),
          kj::strTree(),

          kj::strTree(
              // We declare enums in the capnp::schemas namespace and then typedef them into
              // place because we don't want them to be parameterized for generics.
              "enum class ", name, "_", hexId, ": uint16_t {\n",
              KJ_MAP(e, enumerants) {
                return kj::strTree("  ", toUpperCase(protoName(e.getProto())), ",\n");
              },
              "};\n"
              "CAPNP_DECLARE_ENUM(", name, ", ", hexId, ");\n"),
          kj::strTree(
              "CAPNP_DEFINE_ENUM(", name, "_", hexId, ", ", hexId, ");\n"),

          kj::strTree(),
        };
      }

      case schema::Node::INTERFACE: {
        hasInterfaces = true;

        InterfaceText interfaceText =
            makeInterfaceText(scope, name, schema.asInterface(), kj::mv(nestedTypeDecls),
                              templateContext);

        return NodeText {
          kj::mv(interfaceText.outerTypeDecl),
          kj::mv(interfaceText.outerTypeDef),
          kj::mv(interfaceText.clientServerDefs),
          kj::mv(interfaceText.inlineMethodDefs),

          kj::strTree(),
          kj::strTree(),

          kj::mv(interfaceText.sourceDefs),
        };
      }

      case schema::Node::CONST: {
        auto constText = makeConstText(scope, name, schema.asConst(), templateContext);

        return NodeText {
          scope.size() == 0 ? kj::strTree() : kj::strTree("  ", kj::mv(constText.decl)),
          scope.size() > 0 ? kj::strTree() : kj::mv(constText.decl),
          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
          kj::strTree(),

          kj::mv(constText.def),
        };
      }

      case schema::Node::ANNOTATION: {
        return NodeText {
          kj::strTree(),
          kj::strTree(),
          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
          kj::strTree(),

          kj::strTree(),
        };
      }
    }

    KJ_UNREACHABLE;
  }